

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::TableInitExpr,_std::default_delete<wabt::TableInitExpr>_> __thiscall
wabt::MakeUnique<wabt::TableInitExpr,wabt::Var,wabt::Var>(wabt *this,Var *args,Var *args_1)

{
  Var *table_index;
  Var *segment_index;
  TableInitExpr *this_00;
  Location local_40;
  Var *local_20;
  Var *args_local_1;
  Var *args_local;
  
  local_20 = args_1;
  args_local_1 = args;
  args_local = (Var *)this;
  this_00 = (TableInitExpr *)operator_new(0xd0);
  segment_index = args_local_1;
  table_index = local_20;
  Location::Location(&local_40);
  TableInitExpr::TableInitExpr(this_00,segment_index,table_index,&local_40);
  std::unique_ptr<wabt::TableInitExpr,std::default_delete<wabt::TableInitExpr>>::
  unique_ptr<std::default_delete<wabt::TableInitExpr>,void>
            ((unique_ptr<wabt::TableInitExpr,std::default_delete<wabt::TableInitExpr>> *)this,
             this_00);
  return (__uniq_ptr_data<wabt::TableInitExpr,_std::default_delete<wabt::TableInitExpr>,_true,_true>
         )(__uniq_ptr_data<wabt::TableInitExpr,_std::default_delete<wabt::TableInitExpr>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}